

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int canvas_undo_arrange(_glist *x,void *z,int action)

{
  int iVar1;
  _gobj *p_Var2;
  int iVar3;
  t_gobj *ptVar4;
  t_gobj *ptVar5;
  t_gobj *ptVar6;
  _gobj *p_Var7;
  
  if ((x->field_0xe8 & 0x20) == 0) {
    canvas_editmode(x,1.0);
  }
  if (action == 0) {
    freebytes(z,8);
    return 1;
  }
  if (action == 2) {
    if (*(int *)((long)z + 4) == *z) {
      return 1;
    }
    ptVar4 = glist_nth(x,*z);
    glist_noselect(x);
    glist_select(x,ptVar4);
    iVar1 = *(int *)((long)z + 4);
    iVar3 = glist_getindex(x,ptVar4);
    if (iVar3 == 0) {
      ptVar5 = (t_gobj *)0x0;
    }
    else {
      ptVar5 = glist_nth(x,*z + -1);
    }
    p_Var7 = ptVar4->g_next;
    iVar3 = glist_getindex(x,(t_gobj *)0x0);
    ptVar6 = glist_nth(x,iVar3 + -1);
    if (iVar1 == 0) {
      p_Var2 = x->gl_list;
      x->gl_list = ptVar4;
      ptVar4->g_next = p_Var2;
      if (ptVar5 == (t_gobj *)0x0) goto LAB_0013a7f1;
      if (p_Var7 == (_gobj *)0x0) {
        ptVar5->g_next = (_gobj *)0x0;
        goto LAB_0013a7f1;
      }
    }
    else {
      ptVar6->g_next = ptVar4;
      ptVar4->g_next = (_gobj *)0x0;
      if (ptVar5 == (t_gobj *)0x0) {
        x->gl_list = p_Var7;
        goto LAB_0013a7f1;
      }
    }
    ptVar5->g_next = p_Var7;
LAB_0013a7f1:
    canvas_dirty(x,1.0);
    return 1;
  }
  if (action != 1) {
    return 1;
  }
  if (*(int *)((long)z + 4) == *z) {
    return 1;
  }
  ptVar4 = glist_nth(x,*(int *)((long)z + 4));
  glist_noselect(x);
  glist_select(x,ptVar4);
  if (*(int *)((long)z + 4) == 0) {
    ptVar5 = glist_nth(x,*z);
    p_Var7 = ptVar5->g_next;
    x->gl_list = ptVar4->g_next;
  }
  else {
    ptVar5 = glist_nth(x,*(int *)((long)z + 4) + -1);
    ptVar5->g_next = (_gobj *)0x0;
    if (*z == 0) {
      ptVar4->g_next = x->gl_list;
      x->gl_list = ptVar4;
      goto LAB_0013a830;
    }
    ptVar5 = glist_nth(x,*z + -1);
    p_Var7 = ptVar5->g_next;
  }
  ptVar5->g_next = ptVar4;
  ptVar4->g_next = p_Var7;
LAB_0013a830:
  if ((x->field_0xe8 & 1) != 0) {
    canvas_redraw(x);
  }
  return 1;
}

Assistant:

int canvas_undo_arrange(t_canvas *x, void *z, int action)
{
    t_undo_arrange *buf = z;
    t_gobj *y=NULL, *prev=NULL, *next=NULL;

    if (!x->gl_edit)
        canvas_editmode(x, 1);

    switch(action)
    {

    case UNDO_UNDO:
        if(buf->u_newindex == buf->u_previndex) return 1;
            /* this is our object */
        y = glist_nth(x, buf->u_newindex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (buf->u_newindex)
        {
                /* if it is the last object */

                /* first previous object should point to nothing */
            prev = glist_nth(x, buf->u_newindex - 1);
            prev->g_next = NULL;

                /* now we reuse vars for the following:
                   old index should be right before the object previndex
                   is pointing to as the object was moved to the end */

                /* old position is not first */
            if (buf->u_previndex)
            {
                prev = glist_nth(x, buf->u_previndex - 1);
                next = prev->g_next;

                    /* now readjust pointers */
                prev->g_next = y;
                y->g_next = next;
            }
                /* old position is first */
            else {
                prev = NULL;
                next = x->gl_list;

                    /* now readjust pointers */
                y->g_next = next;
                x->gl_list = y;
            }
        }
        else {
                /* if it is the first object */

                /* old index should be right after the object previndex
                   is pointing to as the object was moved to the end */
            prev = glist_nth(x, buf->u_previndex);

                /* next may be NULL and that is ok */
            next = prev->g_next;

                /* first glist pointer needs to point to the second object */
            x->gl_list = y->g_next;

                /* now readjust pointers */
            prev->g_next = y;
            y->g_next = next;
        }
            /* and finally redraw canvas */
        if (x->gl_havewindow)
            canvas_redraw(x);
        break;
    case UNDO_REDO:
    {
        t_gobj *oldy_prev=NULL, *oldy_next=NULL;
        int arrangeaction;

        if(buf->u_newindex == buf->u_previndex) return 1;
            /* find our object */
        y = glist_nth(x, buf->u_previndex);

            /* select object */
        glist_noselect(x);
        glist_select(x, y);

        if (!buf->u_newindex) arrangeaction = 4;
        else arrangeaction = 3;


            /* if there is an object before ours (in other words our index is > 0) */
        if (glist_getindex(x,y))
            oldy_prev = glist_nth(x, buf->u_previndex - 1);

            /* if there is an object after ours */
        if (y->g_next)
            oldy_next = y->g_next;

        canvas_doarrange(x, arrangeaction, y, oldy_prev, oldy_next);
    }
        break;
    case UNDO_FREE:
        t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}